

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

predictor * __thiscall
Search::predictor::add_to<unsigned_int>
          (predictor *this,v_array<unsigned_int> *A,bool *A_is_ptr,uint a,bool clear_first)

{
  uint *__dest;
  size_t __n;
  uint *old_pointer;
  uint *__src;
  size_t nmemb;
  uint local_3c;
  predictor *local_38;
  
  local_38 = this;
  local_3c = a;
  if (*A_is_ptr == true) {
    if (clear_first) {
      __src = A->_begin;
      A->_end = __src;
      nmemb = 1;
      __n = 0;
    }
    else {
      __src = A->_begin;
      __n = (long)A->_end - (long)__src;
      nmemb = ((long)__n >> 2) + 1;
    }
    __dest = calloc_or_throw<unsigned_int>(nmemb);
    A->_begin = __dest;
    A->_end = __dest + nmemb;
    A->end_array = __dest + nmemb;
    memcpy(__dest,__src,__n);
    *A_is_ptr = false;
    A->_begin[nmemb - 1] = a;
  }
  else {
    if (clear_first) {
      v_array<unsigned_int>::clear(A);
    }
    v_array<unsigned_int>::push_back(A,&local_3c);
  }
  return local_38;
}

Assistant:

predictor& predictor::add_to(v_array<T>& A, bool& A_is_ptr, T a, bool clear_first)
{
  if (A_is_ptr)  // we need to make our own memory
  {
    if (clear_first)
      A.end() = A.begin();
    size_t new_size = clear_first ? 1 : (A.size() + 1);
    make_new_pointer<T>(A, new_size);
    A_is_ptr = false;
    A[new_size - 1] = a;
  }
  else  // we've already allocated our own memory
  {
    if (clear_first)
      A.clear();
    A.push_back(a);
  }
  return *this;
}